

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphIterator.cpp
# Opt level: O1

bool __thiscall GlyphIterator::getPixelValue(GlyphIterator *this,uint32_t pixel)

{
  return (this->font->bitmap[(ulong)(pixel >> 3) + (ulong)this->glyph->bitmapOffset] &
         (byte)(0x80 >> ((byte)pixel & 7))) != 0;
}

Assistant:

bool GlyphIterator::getPixelValue(uint32_t pixel)
{
   const uint8_t * bitmap = this->font->bitmap;
   uint32_t index = this->glyph->bitmapOffset;
   uint8_t value;

   value = bitmap[index + pixel/8]; //get respective byte
   value = value & (0x80 >> (pixel & 7)); //isolate respective bit
   return (value != 0); //return boolean value of pixel
}